

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tztrans.cpp
# Opt level: O3

UBool __thiscall
icu_63::TimeZoneTransition::operator==(TimeZoneTransition *this,TimeZoneTransition *that)

{
  char *__s1;
  char *__s2;
  TimeZoneRule *pTVar1;
  int iVar2;
  UBool UVar3;
  
  UVar3 = '\x01';
  if (this != that) {
    __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
    __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
    if ((__s1 == __s2) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,__s2), iVar2 == 0)))) {
      if ((this->fTime == that->fTime) && (!NAN(this->fTime) && !NAN(that->fTime))) {
        pTVar1 = this->fFrom;
        if ((pTVar1 == (TimeZoneRule *)0x0 && that->fFrom == (TimeZoneRule *)0x0) ||
           ((pTVar1 != (TimeZoneRule *)0x0 && that->fFrom != (TimeZoneRule *)0x0 &&
            (iVar2 = (*(pTVar1->super_UObject)._vptr_UObject[4])(), (char)iVar2 != '\0')))) {
          pTVar1 = this->fTo;
          if (pTVar1 == (TimeZoneRule *)0x0 && that->fTo == (TimeZoneRule *)0x0) {
            return '\x01';
          }
          if ((pTVar1 != (TimeZoneRule *)0x0 && that->fTo != (TimeZoneRule *)0x0) &&
             (iVar2 = (*(pTVar1->super_UObject)._vptr_UObject[4])(), (char)iVar2 != '\0')) {
            return '\x01';
          }
        }
      }
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool
TimeZoneTransition::operator==(const TimeZoneTransition& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    if (fTime != that.fTime) {
        return FALSE;
    }
    if ((fFrom == NULL && that.fFrom == NULL)
        || (fFrom != NULL && that.fFrom != NULL && *fFrom == *(that.fFrom))) {
        if ((fTo == NULL && that.fTo == NULL)
            || (fTo != NULL && that.fTo != NULL && *fTo == *(that.fTo))) {
            return TRUE;
        }
    }
    return FALSE;
}